

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_1,_3,_1,_1,_3> *dst,Matrix<double,_3,_1,_0,_3,_1> *src,
               assign_op<double,_double> *func)

{
  Transpose<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> local_28;
  ActualDstType actualDst;
  assign_op<double,_double> *func_local;
  Matrix<double,_3,_1,_0,_3,_1> *src_local;
  Matrix<double,_1,_3,_1,_1,_3> *dst_local;
  
  actualDst.m_matrix = (non_const_type)func;
  Transpose<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::Transpose(&local_28,dst);
  Assignment<Eigen::Transpose<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_28,src,(assign_op<double,_double> *)actualDst.m_matrix);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}